

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O0

void VisitWithStmt<ParseNodeVisitor<FuncInfo>,ParseNodeVisitor<FuncInfo>>
               (ParseNode *pnode,RegSlot loc,ByteCodeGenerator *byteCodeGenerator,
               ParseNodeVisitor<FuncInfo> prefix,ParseNodeVisitor<FuncInfo> postfix,
               ParseNode *pnodeParent)

{
  Scope *innerScope;
  ParseNodeWith *pPVar1;
  Scope *scope;
  ParseNode *pnodeParent_local;
  ByteCodeGenerator *byteCodeGenerator_local;
  RegSlot loc_local;
  ParseNode *pnode_local;
  ParseNodeVisitor<FuncInfo> prefix_local;
  
  pPVar1 = ParseNode::AsParseNodeWith(pnode);
  innerScope = pPVar1->scope;
  ByteCodeGenerator::PushScope(byteCodeGenerator,innerScope);
  pPVar1 = ParseNode::AsParseNodeWith(pnode);
  Visit<ParseNodeVisitor<FuncInfo>,ParseNodeVisitor<FuncInfo>>
            (pPVar1->pnodeBody,byteCodeGenerator,prefix,postfix,pnodeParent);
  Scope::SetIsObject(innerScope);
  Scope::SetMustInstantiate(innerScope,true);
  ByteCodeGenerator::PopScope(byteCodeGenerator);
  return;
}

Assistant:

void VisitWithStmt(ParseNode *pnode, Js::RegSlot loc, ByteCodeGenerator* byteCodeGenerator, PrefixFn prefix, PostfixFn postfix, ParseNode *pnodeParent)
{
    // Note the fact that we're visiting the body of a with statement. This allows us to optimize register assignment
    // in the normal case of calls not requiring that their "this" objects be found dynamically.
    Scope *scope = pnode->AsParseNodeWith()->scope;

    byteCodeGenerator->PushScope(scope);
    Visit(pnode->AsParseNodeWith()->pnodeBody, byteCodeGenerator, prefix, postfix, pnodeParent);

    scope->SetIsObject();
    scope->SetMustInstantiate(true);

    byteCodeGenerator->PopScope();
}